

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O0

double __thiscall
trento::MonteCarloCrossSection::operator()(MonteCarloCrossSection *this,double sigma_partonic)

{
  bool bVar1;
  double *pdVar2;
  out_of_range *this_00;
  int __x;
  size_t in_RDI;
  double in_XMM0_Qa;
  double __x_00;
  double dVar3;
  vector<Constituent,_std::allocator<Constituent>_> *this_01;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  double update_difference;
  double cross_section;
  double prob_hit;
  double distance_sq;
  Constituent *qB;
  iterator __end3;
  iterator __begin3;
  vector<Constituent,_std::allocator<Constituent>_> *__range3;
  Constituent *qA;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Constituent,_std::allocator<Constituent>_> *__range2_2;
  double overlap;
  Constituent *q_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Constituent,_std::allocator<Constituent>_> *__range2_1;
  Constituent *q;
  iterator __end2;
  iterator __begin2;
  vector<Constituent,_std::allocator<Constituent>_> *__range2;
  double b;
  size_t n;
  int pass_tolerance;
  double prob_miss;
  double ref_cross_section;
  double max_impact_sq_;
  vector<Constituent,_std::allocator<Constituent>_> nucleonB;
  vector<Constituent,_std::allocator<Constituent>_> nucleonA;
  CyclicNormal<double> cyclic_normal;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffffdf8;
  CyclicNormal<double> *in_stack_fffffffffffffe00;
  allocator_type *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  vector<Constituent,_std::allocator<Constituent>_> *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe78;
  double in_stack_fffffffffffffe80;
  double in_stack_fffffffffffffe88;
  CyclicNormal<double> *in_stack_fffffffffffffe90;
  double local_160;
  double local_158;
  double local_150;
  reference local_148;
  Constituent *local_140;
  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
  local_138;
  undefined1 *local_130;
  reference local_128;
  Constituent *local_120;
  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
  local_118;
  undefined1 *local_110;
  double local_108;
  reference local_100;
  Constituent *local_f8;
  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_> local_f0
  ;
  undefined1 *local_e8;
  reference local_e0;
  Constituent *local_d8;
  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_> local_d0
  ;
  undefined1 *local_c8;
  double local_c0;
  ulong local_b8;
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  undefined1 local_88 [48];
  undefined1 local_58 [72];
  double local_10;
  undefined1 extraout_var [56];
  
  local_10 = in_XMM0_Qa;
  random::CyclicNormal<double>::CyclicNormal
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,in_RDI);
  std::allocator<Constituent>::allocator((allocator<Constituent> *)0x1356e9);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<Constituent>::~allocator((allocator<Constituent> *)0x135715);
  std::allocator<Constituent>::allocator((allocator<Constituent> *)0x135735);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<Constituent>::~allocator((allocator<Constituent> *)0x13575b);
  local_98 = sqr<double>((double *)(in_RDI + 0x20));
  local_a0 = 0.0;
  local_a8 = 0.0;
  local_ac = 0;
  local_b8 = 0;
  while( true ) {
    if (*(ulong *)(in_RDI + 0x38) <= local_b8) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range
                (this_00,
                 "Partonic cross section failed to converge       -- check nucleon width, constituent width, and constituent number"
                );
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    dVar3 = *(double *)(in_RDI + 0x20);
    __x_00 = random::canonical<double>();
    local_c0 = sqrt(__x_00);
    local_c0 = dVar3 * local_c0;
    local_c8 = local_58;
    local_d0._M_current =
         (Constituent *)
         std::vector<Constituent,_std::allocator<Constituent>_>::begin
                   ((vector<Constituent,_std::allocator<Constituent>_> *)in_stack_fffffffffffffdf8);
    local_d8 = (Constituent *)
               std::vector<Constituent,_std::allocator<Constituent>_>::end
                         ((vector<Constituent,_std::allocator<Constituent>_> *)
                          in_stack_fffffffffffffdf8);
    while( true ) {
      bVar1 = __gnu_cxx::operator()
                        ((__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffe00,
                         (__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffdf8);
      if (!bVar1) break;
      local_e0 = __gnu_cxx::
                 __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                 ::operator*(&local_d0);
      pdVar2 = random::CyclicNormal<double>::operator()
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_e0->x = *pdVar2;
      pdVar2 = random::CyclicNormal<double>::operator()
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_e0->y = *pdVar2;
      __gnu_cxx::
      __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>::
      operator++(&local_d0);
    }
    local_e8 = local_88;
    local_f0._M_current =
         (Constituent *)
         std::vector<Constituent,_std::allocator<Constituent>_>::begin
                   ((vector<Constituent,_std::allocator<Constituent>_> *)in_stack_fffffffffffffdf8);
    local_f8 = (Constituent *)
               std::vector<Constituent,_std::allocator<Constituent>_>::end
                         ((vector<Constituent,_std::allocator<Constituent>_> *)
                          in_stack_fffffffffffffdf8);
    while( true ) {
      bVar1 = __gnu_cxx::operator()
                        ((__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffe00,
                         (__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffdf8);
      if (!bVar1) break;
      local_100 = __gnu_cxx::
                  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                  ::operator*(&local_f0);
      pdVar2 = random::CyclicNormal<double>::operator()
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_100->x = *pdVar2;
      pdVar2 = random::CyclicNormal<double>::operator()
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_100->y = *pdVar2;
      __gnu_cxx::
      __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>::
      operator++(&local_f0);
    }
    local_108 = 0.0;
    local_110 = local_58;
    local_118._M_current =
         (Constituent *)
         std::vector<Constituent,_std::allocator<Constituent>_>::begin
                   ((vector<Constituent,_std::allocator<Constituent>_> *)in_stack_fffffffffffffdf8);
    local_120 = (Constituent *)
                std::vector<Constituent,_std::allocator<Constituent>_>::end
                          ((vector<Constituent,_std::allocator<Constituent>_> *)
                           in_stack_fffffffffffffdf8);
    while( true ) {
      __x = (int)&local_118;
      bVar1 = __gnu_cxx::operator()
                        ((__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffe00,
                         (__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                          *)in_stack_fffffffffffffdf8);
      if (!bVar1) break;
      local_128 = __gnu_cxx::
                  __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                  ::operator*(&local_118);
      local_130 = local_88;
      local_138._M_current =
           (Constituent *)
           std::vector<Constituent,_std::allocator<Constituent>_>::begin
                     ((vector<Constituent,_std::allocator<Constituent>_> *)in_stack_fffffffffffffdf8
                     );
      local_140 = (Constituent *)
                  std::vector<Constituent,_std::allocator<Constituent>_>::end
                            ((vector<Constituent,_std::allocator<Constituent>_> *)
                             in_stack_fffffffffffffdf8);
      while( true ) {
        bVar1 = __gnu_cxx::operator()
                          ((__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                            *)in_stack_fffffffffffffe00,
                           (__normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                            *)in_stack_fffffffffffffdf8);
        if (!bVar1) break;
        local_148 = __gnu_cxx::
                    __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>
                    ::operator*(&local_138);
        local_158 = (local_128->x - local_148->x) + local_c0;
        dVar3 = sqr<double>(&local_158);
        local_160 = local_128->y - local_148->y;
        local_150 = sqr<double>(&local_160);
        local_150 = dVar3 + local_150;
        dVar3 = exp((local_150 * -0.25) / *(double *)(in_RDI + 0x28));
        local_108 = dVar3 + local_108;
        __gnu_cxx::
        __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>::
        operator++(&local_138);
      }
      __gnu_cxx::
      __normal_iterator<Constituent_*,_std::vector<Constituent,_std::allocator<Constituent>_>_>::
      operator++(&local_118);
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)(in_RDI + 0x30);
    auVar5 = vcvtusi2sd_avx512f(auVar5,*(undefined8 *)(in_RDI + 0x10));
    auVar4._0_8_ = exp(((-local_10 * *(double *)(in_RDI + 0x30)) / (auVar5._0_8_ + auVar5._0_8_)) *
                       local_108);
    auVar4._8_56_ = extraout_var;
    local_a8 = local_a8 + auVar4._0_8_;
    auVar5 = vcvtusi2sd_avx512f(auVar4._0_16_,local_b8);
    dVar3 = local_98 * 3.141592653589793 * (1.0 - local_a8 / auVar5._0_8_);
    this_01 = (vector<Constituent,_std::allocator<Constituent>_> *)(dVar3 - local_a0);
    std::abs(__x);
    if (*(double *)(in_RDI + 0x58) <= (double)this_01) {
      local_ac = 0;
      local_a0 = dVar3;
    }
    else {
      local_ac = local_ac + 1;
    }
    if (*(int *)(in_RDI + 0x50) < local_ac) break;
    local_b8 = local_b8 + 1;
  }
  std::vector<Constituent,_std::allocator<Constituent>_>::~vector(this_01);
  std::vector<Constituent,_std::allocator<Constituent>_>::~vector(this_01);
  random::CyclicNormal<double>::~CyclicNormal((CyclicNormal<double> *)0x135d7d);
  return dVar3;
}

Assistant:

double MonteCarloCrossSection::operator() (const double sigma_partonic) const {

  random::CyclicNormal<> cyclic_normal{
    0., sampling_width_, cache_size, n_loops
  };

  struct Constituent {
    double x, y;
  };

  std::vector<Constituent> nucleonA(constituent_number_);
  std::vector<Constituent> nucleonB(constituent_number_);

  auto max_impact_sq_ = sqr(max_impact_);
  double ref_cross_section = 0.;
  double prob_miss = 0.;
  int pass_tolerance = 0;

  for (std::size_t n = 0; n < n_max; ++n) {
    // Sample b from P(b)db = 2*pi*b.
    auto b = max_impact_ * std::sqrt(random::canonical<double>());

    for (auto&& q : nucleonA) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    for (auto&& q : nucleonB) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    auto overlap = 0.;
    for (auto&& qA : nucleonA) {
      for (auto&& qB : nucleonB) {
        auto distance_sq = sqr(qA.x - qB.x + b) + sqr(qA.y - qB.y);
        overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
      }
    }

    prob_miss +=
      std::exp(-sigma_partonic * prefactor_/(2.*constituent_number_) * overlap);

    auto prob_hit = 1. - (prob_miss/n);
    auto cross_section = M_PI*max_impact_sq_*prob_hit;

    auto update_difference = std::abs(cross_section - ref_cross_section);

    if (update_difference < tolerance) {
      ++pass_tolerance;
    } else {
      pass_tolerance = 0;
      ref_cross_section = cross_section;
    }

    if (pass_tolerance > n_pass){
      return cross_section;
    }
  }

  throw std::out_of_range{
    "Partonic cross section failed to converge \
      -- check nucleon width, constituent width, and constituent number"};
}